

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_list.h
# Opt level: O2

void __thiscall
spvtools::opt::InstructionList::ForEachInst
          (InstructionList *this,function<void_(spvtools::opt::Instruction_*)> *f,
          bool run_on_debug_line_insts)

{
  Instruction *pIVar1;
  Instruction *this_00;
  
  this_00 = (this->super_IntrusiveList<spvtools::opt::Instruction>).sentinel_.
            super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  while (this_00 != &(this->super_IntrusiveList<spvtools::opt::Instruction>).sentinel_) {
    pIVar1 = (this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    Instruction::ForEachInst(this_00,f,run_on_debug_line_insts);
    this_00 = pIVar1;
  }
  return;
}

Assistant:

inline void ForEachInst(const std::function<void(Instruction*)>& f,
                          bool run_on_debug_line_insts) {
    auto next = begin();
    for (auto i = next; i != end(); i = next) {
      ++next;
      i->ForEachInst(f, run_on_debug_line_insts);
    }
  }